

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio.c
# Opt level: O1

int puts(char *__s)

{
  int iVar1;
  FILE *pFVar2;
  size_t count;
  
  pFVar2 = __stdout();
  count = strlen(__s);
  iVar1 = _Write(pFVar2,__s,count);
  if (iVar1 < 0) {
    iVar1 = -1;
  }
  else {
    pFVar2 = __stdout();
    iVar1 = _Write(pFVar2,"\n",1);
    if (iVar1 < 0) {
      iVar1 = -1;
    }
  }
  return iVar1;
}

Assistant:

int puts(const char *str) {
    int r = _Write(stdout, str, strlen(str));
    if (r < 0) {
        return EOF;
    }

    r = _Write(stdout, "\n", 1);
    if (r < 0) {
        return EOF;
    }

    return r;
}